

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_modifiers_unittest.cc
# Opt level: O2

void Test_TemplateModifiers_ValidateUrlCssEscape::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  int iVar11;
  char *pcVar12;
  TemplateDictionaryPeer peer;
  TemplateString local_1d8;
  TemplateString local_1b8;
  TemplateString local_198;
  TemplateString local_178;
  TemplateString local_158;
  TemplateString local_138;
  TemplateString local_118;
  TemplateString local_f8;
  TemplateString local_d8;
  TemplateString local_b8;
  TemplateString local_98;
  TemplateDictionary dict;
  
  ctemplate::TemplateString::TemplateString(&local_1d8,"TestValidateUrlCssEscape");
  ctemplate::TemplateDictionary::TemplateDictionary(&dict,&local_1d8,(UnsafeArena *)0x0);
  ctemplate::TemplateString::TemplateString(&local_98,"easy http URL");
  ctemplate::TemplateString::TemplateString(&local_b8,"http://www.google.com");
  TVar1.length_ = local_98.length_;
  TVar1.ptr_ = local_98.ptr_;
  TVar1.is_immutable_ = local_98.is_immutable_;
  TVar1._17_7_ = local_98._17_7_;
  TVar1.id_ = local_98.id_;
  TVar6.length_ = local_b8.length_;
  TVar6.ptr_ = local_b8.ptr_;
  TVar6.is_immutable_ = local_b8.is_immutable_;
  TVar6._17_7_ = local_b8._17_7_;
  TVar6.id_ = local_b8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar1,TVar6,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_d8,"harder https URL");
  ctemplate::TemplateString::TemplateString(&local_f8,"https://www.google.com/search?q=f&hl=en");
  TVar2.length_ = local_d8.length_;
  TVar2.ptr_ = local_d8.ptr_;
  TVar2.is_immutable_ = local_d8.is_immutable_;
  TVar2._17_7_ = local_d8._17_7_;
  TVar2.id_ = local_d8.id_;
  TVar7.length_ = local_f8.length_;
  TVar7.ptr_ = local_f8.ptr_;
  TVar7.is_immutable_ = local_f8.is_immutable_;
  TVar7._17_7_ = local_f8._17_7_;
  TVar7.id_ = local_f8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar2,TVar7,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_118,"javascript URL");
  ctemplate::TemplateString::TemplateString(&local_138,"javascript:alert(document.cookie)");
  TVar3.length_ = local_118.length_;
  TVar3.ptr_ = local_118.ptr_;
  TVar3.is_immutable_ = local_118.is_immutable_;
  TVar3._17_7_ = local_118._17_7_;
  TVar3.id_ = local_118.id_;
  TVar8.length_ = local_138.length_;
  TVar8.ptr_ = local_138.ptr_;
  TVar8.is_immutable_ = local_138.is_immutable_;
  TVar8._17_7_ = local_138._17_7_;
  TVar8.id_ = local_138.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar3,TVar8,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_158,"relative URL");
  ctemplate::TemplateString::TemplateString(&local_178,"/search?q=green flowers&hl=en");
  TVar4.length_ = local_158.length_;
  TVar4.ptr_ = local_158.ptr_;
  TVar4.is_immutable_ = local_158.is_immutable_;
  TVar4._17_7_ = local_158._17_7_;
  TVar4.id_ = local_158.id_;
  TVar9.length_ = local_178.length_;
  TVar9.ptr_ = local_178.ptr_;
  TVar9.is_immutable_ = local_178.is_immutable_;
  TVar9._17_7_ = local_178._17_7_;
  TVar9.id_ = local_178.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar4,TVar9,(TemplateModifier *)&dict);
  ctemplate::TemplateString::TemplateString(&local_198,"hardest URL");
  ctemplate::TemplateString::TemplateString
            (&local_1b8,"http://www.google.com/s?q=\'bla\'&a=\"\"&b=(<tag>)&c=*\r\n\\\\bla");
  TVar5.length_ = local_198.length_;
  TVar5.ptr_ = local_198.ptr_;
  TVar5.is_immutable_ = local_198.is_immutable_;
  TVar5._17_7_ = local_198._17_7_;
  TVar5.id_ = local_198.id_;
  TVar10.length_ = local_1b8.length_;
  TVar10.ptr_ = local_1b8.ptr_;
  TVar10.is_immutable_ = local_1b8.is_immutable_;
  TVar10._17_7_ = local_1b8._17_7_;
  TVar10.id_ = local_1b8.id_;
  ctemplate::TemplateDictionary::SetEscapedValue(TVar5,TVar10,(TemplateModifier *)&dict);
  peer.dict_ = &dict;
  ctemplate::TemplateString::TemplateString(&local_1d8,"easy http URL");
  pcVar12 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_1d8);
  iVar11 = strcmp(pcVar12,"http://www.google.com");
  if (iVar11 == 0) {
    ctemplate::TemplateString::TemplateString(&local_1d8,"harder https URL");
    pcVar12 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_1d8);
    iVar11 = strcmp(pcVar12,"https://www.google.com/search?q=f&hl=en");
    if (iVar11 == 0) {
      ctemplate::TemplateString::TemplateString(&local_1d8,"javascript URL");
      pcVar12 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_1d8);
      iVar11 = strcmp(pcVar12,ctemplate::ValidateUrl::kUnsafeUrlReplacement);
      if (iVar11 == 0) {
        ctemplate::TemplateString::TemplateString(&local_1d8,"relative URL");
        pcVar12 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_1d8);
        iVar11 = strcmp(pcVar12,"/search?q=green flowers&hl=en");
        if (iVar11 == 0) {
          ctemplate::TemplateString::TemplateString(&local_1d8,"hardest URL");
          pcVar12 = ctemplate::TemplateDictionaryPeer::GetSectionValue(&peer,&local_1d8);
          iVar11 = strcmp(pcVar12,
                          "http://www.google.com/s?q=%27bla%27&a=%22%22&b=%28%3Ctag%3E%29&c=%2A%0D%0A%5C%5Cbla"
                         );
          if (iVar11 == 0) {
            ctemplate::TemplateDictionary::~TemplateDictionary(&dict);
            return;
          }
          pcVar12 = 
          "strcmp(peer.GetSectionValue(\"hardest URL\"), \"http://www.google.com/s?q=%27bla%27\" \"&a=%22%22&b=%28%3Ctag%3E%29&c=%2A%0D%0A%5C%5Cbla\") == 0"
          ;
        }
        else {
          pcVar12 = 
          "strcmp(peer.GetSectionValue(\"relative URL\"), \"/search?q=green flowers&hl=en\") == 0";
        }
      }
      else {
        pcVar12 = 
        "strcmp(peer.GetSectionValue(\"javascript URL\"), ctemplate::ValidateUrl::kUnsafeUrlReplacement) == 0"
        ;
      }
    }
    else {
      pcVar12 = 
      "strcmp(peer.GetSectionValue(\"harder https URL\"), \"https://www.google.com/search?q=f&hl=en\") == 0"
      ;
    }
  }
  else {
    pcVar12 = "strcmp(peer.GetSectionValue(\"easy http URL\"), \"http://www.google.com\") == 0";
  }
  fprintf(_stderr,"Check failed: %s\n",pcVar12);
  exit(1);
}

Assistant:

TEST(TemplateModifiers, ValidateUrlCssEscape) {
  GOOGLE_NAMESPACE::TemplateDictionary dict("TestValidateUrlCssEscape", NULL);
  dict.SetEscapedValue("easy http URL", "http://www.google.com",
                       GOOGLE_NAMESPACE::validate_url_and_css_escape);
  dict.SetEscapedValue("harder https URL",
                       "https://www.google.com/search?q=f&hl=en",
                       GOOGLE_NAMESPACE::validate_url_and_css_escape);
  dict.SetEscapedValue("javascript URL",
                       "javascript:alert(document.cookie)",
                       GOOGLE_NAMESPACE::validate_url_and_css_escape);
  dict.SetEscapedValue("relative URL", "/search?q=green flowers&hl=en",
                       GOOGLE_NAMESPACE::validate_url_and_css_escape);
  dict.SetEscapedValue("hardest URL", "http://www.google.com/s?q='bla'"
                       "&a=\"\"&b=(<tag>)&c=*\r\n\\\\bla",
                       GOOGLE_NAMESPACE::validate_url_and_css_escape);

  GOOGLE_NAMESPACE::TemplateDictionaryPeer peer(&dict);  // peer can look inside dicts
  EXPECT_STREQ(peer.GetSectionValue("easy http URL"),
               "http://www.google.com");
  EXPECT_STREQ(peer.GetSectionValue("harder https URL"),
               "https://www.google.com/search?q=f&hl=en");
  EXPECT_STREQ(peer.GetSectionValue("javascript URL"),
               GOOGLE_NAMESPACE::ValidateUrl::kUnsafeUrlReplacement);
  EXPECT_STREQ(peer.GetSectionValue("relative URL"),
               "/search?q=green flowers&hl=en");
  EXPECT_STREQ(peer.GetSectionValue("hardest URL"),
               "http://www.google.com/s?q=%27bla%27"
               "&a=%22%22&b=%28%3Ctag%3E%29&c=%2A%0D%0A%5C%5Cbla");
}